

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::Type> __thiscall
mocker::Parser::type(Parser *this,TokIter *iter,TokIter end)

{
  bool bVar1;
  TokenID TVar2;
  pointer pTVar3;
  TokIter in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::Type> sVar4;
  Position beg_00;
  Position end_00;
  pair<mocker::Position,_mocker::Position> local_108;
  size_t local_e8;
  shared_ptr<mocker::ast::Type> *psStack_e0;
  pair<mocker::Position,_mocker::Position> local_d8;
  size_t local_b8;
  size_t sStack_b0;
  Parser local_a0;
  Token *local_88;
  GetTokenID local_68;
  GetTokenID id;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  shared_ptr<mocker::ast::Type> res;
  TokIter beg;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  res.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)end._M_current;
  nonarrayType((Parser *)local_50,iter,end);
  std::shared_ptr<mocker::ast::Type>::shared_ptr<mocker::ast::NonarrayType,void>
            ((shared_ptr<mocker::ast::Type> *)local_40,
             (shared_ptr<mocker::ast::NonarrayType> *)local_50);
  std::shared_ptr<mocker::ast::NonarrayType>::~shared_ptr
            ((shared_ptr<mocker::ast::NonarrayType> *)local_50);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if (bVar1) {
    GetTokenID::GetTokenID(&local_68,in_RCX);
    while( true ) {
      local_88 = *end._M_current;
      TVar2 = GetTokenID::operator()(&local_68,(TokIter)local_88);
      if (TVar2 != LeftBracket) break;
      __gnu_cxx::
      __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
      ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                    *)end._M_current);
      local_a0.pos = *(unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                       **)end._M_current;
      TVar2 = GetTokenID::operator()(&local_68,(TokIter)local_a0.pos);
      if (TVar2 != RightBracket) {
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)end._M_current =
             res.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        std::shared_ptr<mocker::ast::Type>::shared_ptr
                  ((shared_ptr<mocker::ast::Type> *)this,(nullptr_t)0x0);
        goto LAB_00252569;
      }
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                             *)&res.
                                super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      Token::position(&local_d8,pTVar3);
      local_b8 = local_d8.first.line;
      sStack_b0 = local_d8.first.col;
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
               ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                             *)end._M_current);
      Token::position(&local_108,pTVar3);
      local_e8 = local_108.second.line;
      psStack_e0 = (shared_ptr<mocker::ast::Type> *)local_108.second.col;
      beg_00.col = local_b8;
      beg_00.line = (size_t)iter;
      end_00.col = local_108.second.line;
      end_00.line = sStack_b0;
      makeNode<mocker::ast::ArrayType,std::shared_ptr<mocker::ast::Type>&>
                (&local_a0,beg_00,end_00,(shared_ptr<mocker::ast::Type> *)local_108.second.col);
      std::shared_ptr<mocker::ast::Type>::operator=
                ((shared_ptr<mocker::ast::Type> *)local_40,
                 (shared_ptr<mocker::ast::ArrayType> *)&local_a0);
      std::shared_ptr<mocker::ast::ArrayType>::~shared_ptr
                ((shared_ptr<mocker::ast::ArrayType> *)&local_a0);
      __gnu_cxx::
      __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
      ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                    *)end._M_current);
    }
    std::shared_ptr<mocker::ast::Type>::shared_ptr
              ((shared_ptr<mocker::ast::Type> *)this,(shared_ptr<mocker::ast::Type> *)local_40);
  }
  else {
    std::shared_ptr<mocker::ast::Type>::shared_ptr
              ((shared_ptr<mocker::ast::Type> *)this,(nullptr_t)0x0);
  }
LAB_00252569:
  id.end._M_current._4_4_ = 1;
  std::shared_ptr<mocker::ast::Type>::~shared_ptr((shared_ptr<mocker::ast::Type> *)local_40);
  sVar4.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Type>)
         sVar4.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Type> Parser::type(TokIter &iter, TokIter end) {
  auto beg = iter;
  std::shared_ptr<ast::Type> res = nonarrayType(iter, end);
  if (!res)
    return nullptr;

  auto id = GetTokenID(end);
  while (id(iter) == TokenID::LeftBracket) {
    ++iter;
    if (id(iter) != TokenID::RightBracket) {
      iter = beg;
      return nullptr;
    }
    res = makeNode<ast::ArrayType>(beg->position().first,
                                   iter->position().second, res);
    ++iter;
  }
  return res;
}